

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O0

string_view mjs::trim(string_view *s)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  bool bVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  string_view sVar6;
  undefined8 local_30;
  size_t len;
  size_t pos;
  string_view *s_local;
  
  len = 0;
  local_30 = std::basic_string_view<char,_std::char_traits<char>_>::length(s);
  while( true ) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length(s);
    bVar4 = false;
    if (len < sVar2) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](s,len);
      iVar1 = isblank((int)*pvVar3);
      bVar4 = iVar1 != 0;
    }
    if (!bVar4) break;
    len = len + 1;
    local_30 = local_30 - 1;
  }
  while( true ) {
    bVar4 = false;
    if (local_30 != 0) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (s,(len + local_30) - 1);
      iVar1 = isblank((int)*pvVar3);
      bVar4 = iVar1 != 0;
    }
    if (!bVar4) break;
    local_30 = local_30 - 1;
  }
  bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr(s,len,local_30);
  sVar6._M_len = bVar5._M_len;
  sVar6._M_str = bVar5._M_str;
  return sVar6;
}

Assistant:

std::string_view trim(const std::string_view& s) {
    size_t pos = 0, len = s.length();
    while (pos < s.length() && isblank(s[pos]))
        ++pos, --len;
    while (len && isblank(s[pos+len-1]))
        --len;
    return s.substr(pos, len);
}